

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O2

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyTableStart(VerifierTemplate<false> *this,uint8_t *table)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  size_t elem;
  ulong elem_00;
  
  elem = (long)table - (long)this->buf_;
  bVar3 = Verify<int>(this,elem);
  if (bVar3) {
    iVar2 = *(int *)table;
    bVar3 = VerifyComplexity(this);
    if (bVar3) {
      elem_00 = elem - (long)iVar2;
      bVar3 = Verify<unsigned_short>(this,elem_00);
      if (bVar3) {
        uVar1 = *(ushort *)(this->buf_ + elem_00);
        if ((uVar1 & 1) != 0) {
          return false;
        }
        if ((uVar1 & 1) != 0 && (((this->opts_).check_alignment ^ 1U) & 1) == 0) {
          return false;
        }
        return elem_00 <= this->size_ - (ulong)uVar1 && (ulong)uVar1 < this->size_;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyTableStart(const uint8_t *const table) {
    // Check the vtable offset.
    const auto tableo = static_cast<size_t>(table - buf_);
    if (!Verify<soffset_t>(tableo)) return false;
    // This offset may be signed, but doing the subtraction unsigned always
    // gives the result we want.
    const auto vtableo =
        tableo - static_cast<size_t>(ReadScalar<soffset_t>(table));
    // Check the vtable size field, then check vtable fits in its entirety.
    if (!(VerifyComplexity() && Verify<voffset_t>(vtableo) &&
          VerifyAlignment(ReadScalar<voffset_t>(buf_ + vtableo),
                          sizeof(voffset_t))))
      return false;
    const auto vsize = ReadScalar<voffset_t>(buf_ + vtableo);
    return Check((vsize & 1) == 0) && Verify(vtableo, vsize);
  }